

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_try::run_impl(statement_try *this)

{
  context_t *pcVar1;
  _Elt_pointer ppsVar2;
  statement_base *psVar3;
  element_type *peVar4;
  undefined *puVar5;
  _Map_pointer pppsVar6;
  _Elt_pointer ppsVar7;
  _Elt_pointer ppsVar8;
  scope_guard scope;
  scope_guard local_f8 [25];
  
  pcVar1 = &(this->super_statement_base).context;
  local_f8[0].context = pcVar1;
  domain_manager::add_domain
            (&(((((this->super_statement_base).context.
                  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance
                ).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_runtime_type).storage);
  ppsVar8 = (this->mTryBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar2 = (this->mTryBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar8 != ppsVar2) {
    ppsVar7 = (this->mTryBody).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar6 = (this->mTryBody).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      puVar5 = current_process;
      psVar3 = *ppsVar8;
      if ((*current_process & 1) != 0) {
        LOCK();
        *current_process = 0;
        UNLOCK();
        event_type::touch((event_type *)(puVar5 + 0xd0),(void *)0x0);
      }
      (*psVar3->_vptr_statement_base[3])(psVar3);
      peVar4 = (((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((peVar4->return_fcall != false) || (peVar4->break_block != false)) ||
         (peVar4->continue_block != false)) break;
      ppsVar8 = ppsVar8 + 1;
      if (ppsVar8 == ppsVar7) {
        ppsVar8 = pppsVar6[1];
        pppsVar6 = pppsVar6 + 1;
        ppsVar7 = ppsVar8 + 0x40;
      }
    } while (ppsVar8 != ppsVar2);
  }
  scope_guard::~scope_guard(local_f8);
  return;
}

Assistant:

void statement_try::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		scope_guard scope(context);
		for (auto &ptr: mTryBody) {
			try {
				ptr->run();
			}
			catch (const lang_error &le) {
				scope.reset();
				context->instance->storage.add_var_no_return(mName, le);
				for (auto &ptr: mCatchBody) {
					try {
						ptr->run();
					}
					catch (const cs::exception &e) {
						throw e;
					}
					catch (const std::exception &e) {
						throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
					}
					if (context->instance->return_fcall || context->instance->break_block ||
					        context->instance->continue_block)
						break;
				}
				return;
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
			if (context->instance->return_fcall || context->instance->break_block || context->instance->continue_block)
				break;
		}
	}